

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SQLiteBuildDB.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_4da258::SQLiteBuildDB::~SQLiteBuildDB(SQLiteBuildDB *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  int in_ESI;
  
  (this->super_BuildDB)._vptr_BuildDB = (_func_int **)&PTR__SQLiteBuildDB_0023cec8;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->dbMutex);
  if (iVar3 == 0) {
    if (this->db != (sqlite3 *)0x0) {
      close(this,in_ESI);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->dbMutex);
    operator_delete((this->dbKeyIDs).Buckets);
    operator_delete((this->engineKeyIDs).Buckets);
    pcVar2 = (this->path)._M_dataplus._M_p;
    paVar1 = &(this->path).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    llbuild::core::BuildDB::~BuildDB(&this->super_BuildDB);
    return;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

virtual ~SQLiteBuildDB() {
    std::lock_guard<std::mutex> guard(dbMutex);
    if (db)
      close();
  }